

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeGetColumn(Parse *pParse,Table *pTab,int iColumn,int iTable,int iReg,u8 p5)

{
  Vdbe *pVVar1;
  Op *pOVar2;
  uint uVar3;
  undefined3 in_register_00000089;
  
  uVar3 = CONCAT31(in_register_00000089,p5);
  sqlite3ExprCodeGetColumnOfTable(pParse->pVdbe,pTab,iTable,iColumn,iReg);
  if (uVar3 != 0) {
    pVVar1 = pParse->pVdbe;
    if (pVVar1->db->mallocFailed == '\0') {
      pOVar2 = pVVar1->aOp + (long)pVVar1->nOp + -1;
    }
    else {
      pOVar2 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if (pOVar2->opcode != '^') {
      if (pOVar2->opcode != 0xb0) {
        return iReg;
      }
      uVar3 = (uint)(p5 & 1);
    }
    pOVar2->p5 = (ushort)uVar3 & 0xff;
  }
  return iReg;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeGetColumn(
  Parse *pParse,   /* Parsing and code generating context */
  Table *pTab,     /* Description of the table we are reading from */
  int iColumn,     /* Index of the table column */
  int iTable,      /* The cursor pointing to the table */
  int iReg,        /* Store results here */
  u8 p5            /* P5 value for OP_Column + FLAGS */
){
  assert( pParse->pVdbe!=0 );
  assert( (p5 & (OPFLAG_NOCHNG|OPFLAG_TYPEOFARG|OPFLAG_LENGTHARG))==p5 );
  assert( IsVirtual(pTab) || (p5 & OPFLAG_NOCHNG)==0 );
  sqlite3ExprCodeGetColumnOfTable(pParse->pVdbe, pTab, iTable, iColumn, iReg);
  if( p5 ){
    VdbeOp *pOp = sqlite3VdbeGetLastOp(pParse->pVdbe);
    if( pOp->opcode==OP_Column ) pOp->p5 = p5;
    if( pOp->opcode==OP_VColumn ) pOp->p5 = (p5 & OPFLAG_NOCHNG);
  }
  return iReg;
}